

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_units.cpp
# Opt level: O2

void testBaseErrors(string *tempdir)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  ostream *poVar4;
  char *in_RCX;
  char *pcStack_10;
  
  lVar2 = exr_get_default_error_message(0);
  if (lVar2 == 0) {
    pcVar3 = "false";
    pcStack_10 = (char *)0x50;
  }
  else {
    lVar2 = exr_get_default_error_message(1);
    if (lVar2 == 0) {
      pcVar3 = "false";
      pcStack_10 = (char *)0x52;
    }
    else {
      lVar2 = exr_get_default_error_message(0x21);
      if (lVar2 == 0) {
        pcVar3 = "false";
        pcStack_10 = (char *)0x54;
      }
      else {
        pcVar3 = (char *)exr_get_default_error_message(0xffffffffffffffff);
        if (pcVar3 != (char *)0x0) {
          iVar1 = strcmp(pcVar3,"Unknown error code");
          if (iVar1 == 0) {
            lVar2 = exr_get_default_error_message(0x22);
            if (lVar2 == 0) {
              pcVar3 = "false";
              pcStack_10 = (char *)0x5c;
            }
            else {
              pcVar3 = (char *)exr_get_default_error_message(0x6e);
              if (pcVar3 != (char *)0x0) {
                iVar1 = strcmp(pcVar3,"Unknown error code");
                if (iVar1 == 0) {
                  pcVar3 = (char *)exr_get_error_code_as_string(0);
                  iVar1 = strcmp(pcVar3,"EXR_ERR_SUCCESS");
                  if (iVar1 == 0) {
                    pcVar3 = (char *)exr_get_error_code_as_string(0x21);
                    iVar1 = strcmp(pcVar3,"EXR_ERR_UNKNOWN");
                    if (iVar1 == 0) {
                      pcVar3 = (char *)exr_get_error_code_as_string(0x22);
                      iVar1 = strcmp(pcVar3,"EXR_ERR_UNKNOWN");
                      if (iVar1 == 0) {
                        pcVar3 = (char *)exr_get_error_code_as_string(0xffffffffffffffff);
                        iVar1 = strcmp(pcVar3,"EXR_ERR_UNKNOWN");
                        if (iVar1 == 0) {
                          pcVar3 = (char *)exr_get_error_code_as_string(0xfffffffffffffffe);
                          iVar1 = strcmp(pcVar3,"EXR_ERR_UNKNOWN");
                          if (iVar1 == 0) {
                            pcVar3 = (char *)exr_get_error_code_as_string(0x80000000);
                            iVar1 = strcmp(pcVar3,"EXR_ERR_UNKNOWN");
                            if (iVar1 == 0) {
                              pcVar3 = (char *)exr_get_error_code_as_string(0xd);
                              iVar1 = strcmp(pcVar3,"EXR_ERR_MISSING_REQ_ATTR");
                              if (iVar1 == 0) {
                                pcVar3 = (char *)exr_get_error_code_as_string(1);
                                iVar1 = strcmp(pcVar3,"EXR_ERR_OUT_OF_MEMORY");
                                if (iVar1 == 0) {
                                  pcVar3 = (char *)exr_get_error_code_as_string(2);
                                  iVar1 = strcmp(pcVar3,"EXR_ERR_MISSING_CONTEXT_ARG");
                                  if (iVar1 != 0) {
                                    core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_MISSING_CONTEXT_ARG), \"EXR_ERR_MISSING_CONTEXT_ARG\")"
                                                  ,(char *)0x82,0x15412a,in_RCX);
                                  }
                                  pcVar3 = (char *)exr_get_error_code_as_string(3);
                                  iVar1 = strcmp(pcVar3,"EXR_ERR_INVALID_ARGUMENT");
                                  if (iVar1 != 0) {
                                    core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_INVALID_ARGUMENT), \"EXR_ERR_INVALID_ARGUMENT\")"
                                                  ,(char *)0x86,0x15412a,in_RCX);
                                  }
                                  pcVar3 = (char *)exr_get_error_code_as_string(4);
                                  iVar1 = strcmp(pcVar3,"EXR_ERR_ARGUMENT_OUT_OF_RANGE");
                                  if (iVar1 != 0) {
                                    core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_ARGUMENT_OUT_OF_RANGE), \"EXR_ERR_ARGUMENT_OUT_OF_RANGE\")"
                                                  ,(char *)0x8a,0x15412a,in_RCX);
                                  }
                                  pcVar3 = (char *)exr_get_error_code_as_string(5);
                                  iVar1 = strcmp(pcVar3,"EXR_ERR_FILE_ACCESS");
                                  if (iVar1 != 0) {
                                    core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_FILE_ACCESS), \"EXR_ERR_FILE_ACCESS\")"
                                                  ,(char *)0x8e,0x15412a,in_RCX);
                                  }
                                  pcVar3 = (char *)exr_get_error_code_as_string(6);
                                  iVar1 = strcmp(pcVar3,"EXR_ERR_FILE_BAD_HEADER");
                                  if (iVar1 != 0) {
                                    core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_FILE_BAD_HEADER), \"EXR_ERR_FILE_BAD_HEADER\")"
                                                  ,(char *)0x92,0x15412a,in_RCX);
                                  }
                                  pcVar3 = (char *)exr_get_error_code_as_string(7);
                                  iVar1 = strcmp(pcVar3,"EXR_ERR_NOT_OPEN_READ");
                                  if (iVar1 != 0) {
                                    core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_NOT_OPEN_READ), \"EXR_ERR_NOT_OPEN_READ\")"
                                                  ,(char *)0x96,0x15412a,in_RCX);
                                  }
                                  pcVar3 = (char *)exr_get_error_code_as_string(8);
                                  iVar1 = strcmp(pcVar3,"EXR_ERR_NOT_OPEN_WRITE");
                                  if (iVar1 != 0) {
                                    core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_NOT_OPEN_WRITE), \"EXR_ERR_NOT_OPEN_WRITE\")"
                                                  ,(char *)0x9a,0x15412a,in_RCX);
                                  }
                                  pcVar3 = (char *)exr_get_error_code_as_string(9);
                                  iVar1 = strcmp(pcVar3,"EXR_ERR_HEADER_NOT_WRITTEN");
                                  if (iVar1 != 0) {
                                    core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_HEADER_NOT_WRITTEN), \"EXR_ERR_HEADER_NOT_WRITTEN\")"
                                                  ,(char *)0x9e,0x15412a,in_RCX);
                                  }
                                  pcVar3 = (char *)exr_get_error_code_as_string(10);
                                  iVar1 = strcmp(pcVar3,"EXR_ERR_READ_IO");
                                  if (iVar1 != 0) {
                                    core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_READ_IO), \"EXR_ERR_READ_IO\")"
                                                  ,(char *)0xa2,0x15412a,in_RCX);
                                  }
                                  pcVar3 = (char *)exr_get_error_code_as_string(0xb);
                                  iVar1 = strcmp(pcVar3,"EXR_ERR_WRITE_IO");
                                  if (iVar1 != 0) {
                                    core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_WRITE_IO), \"EXR_ERR_WRITE_IO\")"
                                                  ,(char *)0xa6,0x15412a,in_RCX);
                                  }
                                  pcVar3 = (char *)exr_get_error_code_as_string(0xc);
                                  iVar1 = strcmp(pcVar3,"EXR_ERR_NAME_TOO_LONG");
                                  if (iVar1 != 0) {
                                    core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_NAME_TOO_LONG), \"EXR_ERR_NAME_TOO_LONG\")"
                                                  ,(char *)0xaa,0x15412a,in_RCX);
                                  }
                                  pcVar3 = (char *)exr_get_error_code_as_string(0xd);
                                  iVar1 = strcmp(pcVar3,"EXR_ERR_MISSING_REQ_ATTR");
                                  if (iVar1 != 0) {
                                    core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_MISSING_REQ_ATTR), \"EXR_ERR_MISSING_REQ_ATTR\")"
                                                  ,(char *)0xae,0x15412a,in_RCX);
                                  }
                                  pcVar3 = (char *)exr_get_error_code_as_string(0xe);
                                  iVar1 = strcmp(pcVar3,"EXR_ERR_INVALID_ATTR");
                                  if (iVar1 != 0) {
                                    core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_INVALID_ATTR), \"EXR_ERR_INVALID_ATTR\")"
                                                  ,(char *)0xb2,0x15412a,in_RCX);
                                  }
                                  pcVar3 = (char *)exr_get_error_code_as_string(0xf);
                                  iVar1 = strcmp(pcVar3,"EXR_ERR_NO_ATTR_BY_NAME");
                                  if (iVar1 != 0) {
                                    core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_NO_ATTR_BY_NAME), \"EXR_ERR_NO_ATTR_BY_NAME\")"
                                                  ,(char *)0xb6,0x15412a,in_RCX);
                                  }
                                  pcVar3 = (char *)exr_get_error_code_as_string(0x16);
                                  iVar1 = strcmp(pcVar3,"EXR_ERR_BAD_CHUNK_LEADER");
                                  if (iVar1 != 0) {
                                    core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_BAD_CHUNK_LEADER), \"EXR_ERR_BAD_CHUNK_LEADER\")"
                                                  ,(char *)0xba,0x15412a,in_RCX);
                                  }
                                  pcVar3 = (char *)exr_get_error_code_as_string(0x17);
                                  iVar1 = strcmp(pcVar3,"EXR_ERR_CORRUPT_CHUNK");
                                  if (iVar1 == 0) {
                                    pcVar3 = (char *)exr_get_error_code_as_string(0x1f);
                                    iVar1 = strcmp(pcVar3,"EXR_ERR_INVALID_SAMPLE_DATA");
                                    if (iVar1 != 0) {
                                      core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_INVALID_SAMPLE_DATA), \"EXR_ERR_INVALID_SAMPLE_DATA\")"
                                                  ,(char *)0xc2,0x15412a,in_RCX);
                                    }
                                    pcVar3 = (char *)exr_get_error_code_as_string(0x10);
                                    iVar1 = strcmp(pcVar3,"EXR_ERR_ATTR_TYPE_MISMATCH");
                                    if (iVar1 != 0) {
                                      core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_ATTR_TYPE_MISMATCH), \"EXR_ERR_ATTR_TYPE_MISMATCH\")"
                                                  ,(char *)0xc6,0x15412a,in_RCX);
                                    }
                                    pcVar3 = (char *)exr_get_error_code_as_string(0x11);
                                    iVar1 = strcmp(pcVar3,"EXR_ERR_ATTR_SIZE_MISMATCH");
                                    if (iVar1 != 0) {
                                      core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_ATTR_SIZE_MISMATCH), \"EXR_ERR_ATTR_SIZE_MISMATCH\")"
                                                  ,(char *)0xca,0x15412a,in_RCX);
                                    }
                                    pcVar3 = (char *)exr_get_error_code_as_string(0x18);
                                    iVar1 = strcmp(pcVar3,"EXR_ERR_INCOMPLETE_CHUNK_TABLE");
                                    if (iVar1 != 0) {
                                      core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_INCOMPLETE_CHUNK_TABLE), \"EXR_ERR_INCOMPLETE_CHUNK_TABLE\")"
                                                  ,(char *)0xce,0x15412a,in_RCX);
                                    }
                                    pcVar3 = (char *)exr_get_error_code_as_string(0x12);
                                    iVar1 = strcmp(pcVar3,"EXR_ERR_SCAN_TILE_MIXEDAPI");
                                    if (iVar1 != 0) {
                                      core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_SCAN_TILE_MIXEDAPI), \"EXR_ERR_SCAN_TILE_MIXEDAPI\")"
                                                  ,(char *)0xd2,0x15412a,in_RCX);
                                    }
                                    pcVar3 = (char *)exr_get_error_code_as_string(0x13);
                                    iVar1 = strcmp(pcVar3,"EXR_ERR_TILE_SCAN_MIXEDAPI");
                                    if (iVar1 != 0) {
                                      core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_TILE_SCAN_MIXEDAPI), \"EXR_ERR_TILE_SCAN_MIXEDAPI\")"
                                                  ,(char *)0xd6,0x15412a,in_RCX);
                                    }
                                    pcVar3 = (char *)exr_get_error_code_as_string(0x14);
                                    iVar1 = strcmp(pcVar3,"EXR_ERR_MODIFY_SIZE_CHANGE");
                                    if (iVar1 != 0) {
                                      core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_MODIFY_SIZE_CHANGE), \"EXR_ERR_MODIFY_SIZE_CHANGE\")"
                                                  ,(char *)0xda,0x15412a,in_RCX);
                                    }
                                    pcVar3 = (char *)exr_get_error_code_as_string(0x15);
                                    iVar1 = strcmp(pcVar3,"EXR_ERR_ALREADY_WROTE_ATTRS");
                                    if (iVar1 == 0) {
                                      pcVar3 = (char *)exr_get_error_code_as_string(0x19);
                                      iVar1 = strcmp(pcVar3,"EXR_ERR_INCORRECT_PART");
                                      if (iVar1 != 0) {
                                        core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_INCORRECT_PART), \"EXR_ERR_INCORRECT_PART\")"
                                                  ,(char *)0xe2,0x15412a,in_RCX);
                                      }
                                      pcVar3 = (char *)exr_get_error_code_as_string(0x1a);
                                      iVar1 = strcmp(pcVar3,"EXR_ERR_INCORRECT_CHUNK");
                                      if (iVar1 != 0) {
                                        core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_INCORRECT_CHUNK), \"EXR_ERR_INCORRECT_CHUNK\")"
                                                  ,(char *)0xe6,0x15412a,in_RCX);
                                      }
                                      pcVar3 = (char *)exr_get_error_code_as_string(0x1b);
                                      iVar1 = strcmp(pcVar3,"EXR_ERR_USE_SCAN_DEEP_WRITE");
                                      if (iVar1 != 0) {
                                        core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_USE_SCAN_DEEP_WRITE), \"EXR_ERR_USE_SCAN_DEEP_WRITE\")"
                                                  ,(char *)0xea,0x15412a,in_RCX);
                                      }
                                      pcVar3 = (char *)exr_get_error_code_as_string(0x1c);
                                      iVar1 = strcmp(pcVar3,"EXR_ERR_USE_TILE_DEEP_WRITE");
                                      if (iVar1 == 0) {
                                        pcVar3 = (char *)exr_get_error_code_as_string(0x1d);
                                        iVar1 = strcmp(pcVar3,"EXR_ERR_USE_SCAN_NONDEEP_WRITE");
                                        if (iVar1 != 0) {
                                          core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_USE_SCAN_NONDEEP_WRITE), \"EXR_ERR_USE_SCAN_NONDEEP_WRITE\")"
                                                  ,(char *)0xf2,0x15412a,in_RCX);
                                        }
                                        pcVar3 = (char *)exr_get_error_code_as_string(0x1e);
                                        iVar1 = strcmp(pcVar3,"EXR_ERR_USE_TILE_NONDEEP_WRITE");
                                        if (iVar1 == 0) {
                                          return;
                                        }
                                        core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_USE_TILE_NONDEEP_WRITE), \"EXR_ERR_USE_TILE_NONDEEP_WRITE\")"
                                                  ,(char *)0xf6,0x15412a,in_RCX);
                                      }
                                      core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_USE_TILE_DEEP_WRITE), \"EXR_ERR_USE_TILE_DEEP_WRITE\")"
                                                  ,(char *)0xee,0x15412a,in_RCX);
                                    }
                                    core_test_fail(
                                                  "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_ALREADY_WROTE_ATTRS), \"EXR_ERR_ALREADY_WROTE_ATTRS\")"
                                                  ,(char *)0xde,0x15412a,in_RCX);
                                  }
                                  core_test_fail("0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_CORRUPT_CHUNK), \"EXR_ERR_CORRUPT_CHUNK\")"
                                                 ,(char *)0xbe,0x15412a,in_RCX);
                                }
                                pcVar3 = 
                                "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_OUT_OF_MEMORY), \"EXR_ERR_OUT_OF_MEMORY\")"
                                ;
                                pcStack_10 = (char *)0x7e;
                              }
                              else {
                                pcVar3 = 
                                "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_MISSING_REQ_ATTR), \"EXR_ERR_MISSING_REQ_ATTR\")"
                                ;
                                pcStack_10 = (char *)0x7a;
                              }
                            }
                            else {
                              pcVar3 = 
                              "0 == strcmp (exr_get_error_code_as_string ((-2147483647-1)), \"EXR_ERR_UNKNOWN\")"
                              ;
                              pcStack_10 = (char *)0x75;
                            }
                          }
                          else {
                            pcVar3 = 
                            "0 == strcmp (exr_get_error_code_as_string (-2), \"EXR_ERR_UNKNOWN\")";
                            pcStack_10 = (char *)0x72;
                          }
                        }
                        else {
                          pcVar3 = 
                          "0 == strcmp (exr_get_error_code_as_string (-1), \"EXR_ERR_UNKNOWN\")";
                          pcStack_10 = (char *)0x70;
                        }
                      }
                      else {
                        pcVar3 = 
                        "0 == strcmp ( exr_get_error_code_as_string ((int) EXR_ERR_UNKNOWN + 1), \"EXR_ERR_UNKNOWN\")"
                        ;
                        pcStack_10 = (char *)0x6e;
                      }
                    }
                    else {
                      pcVar3 = 
                      "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_UNKNOWN), \"EXR_ERR_UNKNOWN\")"
                      ;
                      pcStack_10 = (char *)0x6a;
                    }
                  }
                  else {
                    pcVar3 = 
                    "0 == strcmp ( exr_get_error_code_as_string (EXR_ERR_SUCCESS), \"EXR_ERR_SUCCESS\")"
                    ;
                    pcStack_10 = (char *)0x66;
                  }
                  goto LAB_00109f47;
                }
              }
              pcVar3 = "false";
              pcStack_10 = (char *)0x60;
            }
            goto LAB_00109f47;
          }
        }
        poVar4 = std::operator<<((ostream *)&std::cerr,"errmsg: ");
        poVar4 = std::operator<<(poVar4,pcVar3);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar3 = "false";
        pcStack_10 = (char *)0x59;
      }
    }
  }
LAB_00109f47:
  core_test_fail(pcVar3,pcStack_10,0x15412a,in_RCX);
}

Assistant:

void
testBaseErrors (const std::string& tempdir)
{
    const char* errmsg;

    // just spot check that we get results and don't get null for out
    // of bounds access
    errmsg = exr_get_default_error_message (EXR_ERR_SUCCESS);
    if (errmsg == NULL) { EXRCORE_TEST (false); }
    errmsg = exr_get_default_error_message (EXR_ERR_OUT_OF_MEMORY);
    if (errmsg == NULL) { EXRCORE_TEST (false); }
    errmsg = exr_get_default_error_message (EXR_ERR_UNKNOWN);
    if (errmsg == NULL) { EXRCORE_TEST (false); }
    errmsg = exr_get_default_error_message (-1);
    if (errmsg == NULL || strcmp (errmsg, "Unknown error code"))
    {
        std::cerr << "errmsg: " << errmsg << std::endl;
        EXRCORE_TEST (false);
    }
    errmsg = exr_get_default_error_message ((int) EXR_ERR_UNKNOWN + 1);
    if (errmsg == NULL) { EXRCORE_TEST (false); }
    errmsg = exr_get_default_error_message (110);
    if (errmsg == NULL || strcmp (errmsg, "Unknown error code"))
    {
        EXRCORE_TEST (false);
    }

    EXRCORE_TEST (
        0 ==
        strcmp (
            exr_get_error_code_as_string (EXR_ERR_SUCCESS), "EXR_ERR_SUCCESS"));
    EXRCORE_TEST (
        0 ==
        strcmp (
            exr_get_error_code_as_string (EXR_ERR_UNKNOWN), "EXR_ERR_UNKNOWN"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string ((int) EXR_ERR_UNKNOWN + 1),
                 "EXR_ERR_UNKNOWN"));
    EXRCORE_TEST (
        0 == strcmp (exr_get_error_code_as_string (-1), "EXR_ERR_UNKNOWN"));
    EXRCORE_TEST (
        0 == strcmp (exr_get_error_code_as_string (-2), "EXR_ERR_UNKNOWN"));
    EXRCORE_TEST (
        0 ==
        strcmp (exr_get_error_code_as_string (INT32_MIN), "EXR_ERR_UNKNOWN"));

    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_MISSING_REQ_ATTR),
                 "EXR_ERR_MISSING_REQ_ATTR"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_OUT_OF_MEMORY),
                 "EXR_ERR_OUT_OF_MEMORY"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_MISSING_CONTEXT_ARG),
                 "EXR_ERR_MISSING_CONTEXT_ARG"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_INVALID_ARGUMENT),
                 "EXR_ERR_INVALID_ARGUMENT"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_ARGUMENT_OUT_OF_RANGE),
                 "EXR_ERR_ARGUMENT_OUT_OF_RANGE"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_FILE_ACCESS),
                 "EXR_ERR_FILE_ACCESS"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_FILE_BAD_HEADER),
                 "EXR_ERR_FILE_BAD_HEADER"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_NOT_OPEN_READ),
                 "EXR_ERR_NOT_OPEN_READ"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_NOT_OPEN_WRITE),
                 "EXR_ERR_NOT_OPEN_WRITE"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_HEADER_NOT_WRITTEN),
                 "EXR_ERR_HEADER_NOT_WRITTEN"));
    EXRCORE_TEST (
        0 ==
        strcmp (
            exr_get_error_code_as_string (EXR_ERR_READ_IO), "EXR_ERR_READ_IO"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_WRITE_IO),
                 "EXR_ERR_WRITE_IO"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_NAME_TOO_LONG),
                 "EXR_ERR_NAME_TOO_LONG"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_MISSING_REQ_ATTR),
                 "EXR_ERR_MISSING_REQ_ATTR"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_INVALID_ATTR),
                 "EXR_ERR_INVALID_ATTR"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_NO_ATTR_BY_NAME),
                 "EXR_ERR_NO_ATTR_BY_NAME"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_BAD_CHUNK_LEADER),
                 "EXR_ERR_BAD_CHUNK_LEADER"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_CORRUPT_CHUNK),
                 "EXR_ERR_CORRUPT_CHUNK"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_INVALID_SAMPLE_DATA),
                 "EXR_ERR_INVALID_SAMPLE_DATA"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_ATTR_TYPE_MISMATCH),
                 "EXR_ERR_ATTR_TYPE_MISMATCH"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_ATTR_SIZE_MISMATCH),
                 "EXR_ERR_ATTR_SIZE_MISMATCH"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_INCOMPLETE_CHUNK_TABLE),
                 "EXR_ERR_INCOMPLETE_CHUNK_TABLE"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_SCAN_TILE_MIXEDAPI),
                 "EXR_ERR_SCAN_TILE_MIXEDAPI"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_TILE_SCAN_MIXEDAPI),
                 "EXR_ERR_TILE_SCAN_MIXEDAPI"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_MODIFY_SIZE_CHANGE),
                 "EXR_ERR_MODIFY_SIZE_CHANGE"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_ALREADY_WROTE_ATTRS),
                 "EXR_ERR_ALREADY_WROTE_ATTRS"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_INCORRECT_PART),
                 "EXR_ERR_INCORRECT_PART"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_INCORRECT_CHUNK),
                 "EXR_ERR_INCORRECT_CHUNK"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_USE_SCAN_DEEP_WRITE),
                 "EXR_ERR_USE_SCAN_DEEP_WRITE"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_USE_TILE_DEEP_WRITE),
                 "EXR_ERR_USE_TILE_DEEP_WRITE"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_USE_SCAN_NONDEEP_WRITE),
                 "EXR_ERR_USE_SCAN_NONDEEP_WRITE"));
    EXRCORE_TEST (
        0 == strcmp (
                 exr_get_error_code_as_string (EXR_ERR_USE_TILE_NONDEEP_WRITE),
                 "EXR_ERR_USE_TILE_NONDEEP_WRITE"));
}